

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O3

void Cudd_ApaPowerOfTwo(int digits,DdApaNumber number,int power)

{
  int iVar1;
  uint uVar2;
  
  if (0 < digits) {
    memset(number,0,(ulong)(uint)digits << 2);
  }
  iVar1 = power + 0x1f;
  if (-1 < power) {
    iVar1 = power;
  }
  uVar2 = ~(iVar1 >> 5) + digits;
  if (-1 < (int)uVar2) {
    number[uVar2] = 1 << ((byte)power & 0x1f);
  }
  return;
}

Assistant:

void
Cudd_ApaPowerOfTwo(
  int  digits,
  DdApaNumber  number,
  int  power)
{
    int i;
    int index;

    for (i = 0; i < digits; i++)
        number[i] = 0;
    i = digits - 1 - power / DD_APA_BITS;
    if (i < 0) return;
    index = power & (DD_APA_BITS - 1);
    number[i] = 1 << index;

}